

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void rpc_tests::help_example_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  help_example t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1a8;
  std_string *in_stack_fffffffffffff1b0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1b8;
  const_string *in_stack_fffffffffffff1d0;
  const_string *msg;
  size_t in_stack_fffffffffffff1d8;
  size_t line_num;
  const_string *in_stack_fffffffffffff1e0;
  unit_test_log_t *in_stack_fffffffffffff1e8;
  const_string local_c88 [25];
  undefined1 local_af0 [408];
  undefined1 local_958 [408];
  undefined1 local_7c0 [408];
  help_example local_628;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  help_example::help_example((help_example *)in_stack_fffffffffffff1a8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_7c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [16])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::setup_conditional<rpc_tests::help_example>((help_example *)0x9b2280);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_958,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  help_example::test_method(&local_628);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  this = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [19])in_stack_fffffffffffff1b0);
  file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1b8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff1d8,
             in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::unit_test::teardown_conditional<rpc_tests::help_example>((help_example *)0x9b24a6);
  line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1b8,
             (pointer)in_stack_fffffffffffff1b0,(unsigned_long)in_stack_fffffffffffff1a8);
  msg = local_c88;
  memset(msg,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1a8);
  boost::operator<<(in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
  boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [13])in_stack_fffffffffffff1b0);
  this_00 = boost::operator<<(in_stack_fffffffffffff1b8,(char (*) [15])in_stack_fffffffffffff1b0);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,line_num,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1a8);
  help_example::~help_example((help_example *)in_stack_fffffffffffff1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(help_example)
{
    // test different argument types
    const RPCArgList& args = {{"foo", "bar"}, {"b", true}, {"n", 1}};
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", args), "> bitcoin-cli -named test foo=bar b=true n=1\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", args), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test shell escape
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b'ar"}}), "> bitcoin-cli -named test foo='b'''ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b\"ar"}}), "> bitcoin-cli -named test foo='b\"ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b ar"}}), "> bitcoin-cli -named test foo='b ar'\n");

    // test object params
    UniValue obj_value(UniValue::VOBJ);
    obj_value.pushKV("foo", "bar");
    obj_value.pushKV("b", false);
    obj_value.pushKV("n", 1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", obj_value}}), "> bitcoin-cli -named test name='{\"foo\":\"bar\",\"b\":false,\"n\":1}'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", obj_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test array params
    UniValue arr_value(UniValue::VARR);
    arr_value.push_back("bar");
    arr_value.push_back(false);
    arr_value.push_back(1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", arr_value}}), "> bitcoin-cli -named test name='[\"bar\",false,1]'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", arr_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":[\"bar\",false,1]}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test types don't matter for shell
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("foo", {{"arg", true}}), HelpExampleCliNamed("foo", {{"arg", "true"}}));

    // test types matter for Rpc
    BOOST_CHECK_NE(HelpExampleRpcNamed("foo", {{"arg", true}}), HelpExampleRpcNamed("foo", {{"arg", "true"}}));
}